

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlareState.cpp
# Opt level: O3

KBOOL __thiscall KDIS::DATA_TYPE::FlareState::operator==(FlareState *this,FlareState *Value)

{
  KBOOL KVar1;
  
  KVar1 = EnvironmentRecord::operator!=
                    (&this->super_EnvironmentRecord,&Value->super_EnvironmentRecord);
  if ((((!KVar1) && (this->m_ui32TSC == Value->m_ui32TSC)) &&
      (KVar1 = EntityType::operator!=(&this->m_Src,&Value->m_Src), !KVar1)) &&
     ((this->m_ui32NumInt == Value->m_ui32NumInt && (this->m_ui32NumSrcs == Value->m_ui32NumSrcs))))
  {
    return this->m_ui16GeometryIndex == Value->m_ui16GeometryIndex;
  }
  return false;
}

Assistant:

KBOOL FlareState::operator == ( const FlareState & Value )const
{
    if( EnvironmentRecord::operator !=( Value ) )          return false;
    if( m_ui32TSC           != Value.m_ui32TSC )           return false;
    if( m_Src               != Value.m_Src )               return false;
    if( m_ui32NumInt        != Value.m_ui32NumInt )        return false;
    if( m_ui32NumSrcs       != Value.m_ui32NumSrcs )       return false;
    if( m_ui16GeometryIndex != Value.m_ui16GeometryIndex ) return false;
    return true;
}